

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O0

void Bac_PtrUpdateBox(Vec_Ptr_t *vBox,Vec_Ptr_t *vGatesNames)

{
  int iVar1;
  Mio_Library_t *pLib_00;
  char *pcVar2;
  void *pvVar3;
  Mio_Gate_t *pGate_00;
  char *pName;
  char *pNameNew;
  Mio_Library_t *pLib;
  Mio_Pin_t *pMStack_28;
  int i;
  Mio_Pin_t *pPin;
  Mio_Gate_t *pGate;
  Vec_Ptr_t *vGatesNames_local;
  Vec_Ptr_t *vBox_local;
  
  pLib._4_4_ = 1;
  pLib_00 = (Mio_Library_t *)Abc_FrameReadLibGen();
  pcVar2 = (char *)Vec_PtrEntry(vBox,0);
  iVar1 = strcmp(pcVar2,"Const0T");
  if (iVar1 == 0) {
    pName = (char *)Vec_PtrEntry(vGatesNames,1);
  }
  else {
    iVar1 = strcmp(pcVar2,"Const1T");
    if (iVar1 == 0) {
      pName = (char *)Vec_PtrEntry(vGatesNames,2);
    }
    else {
      iVar1 = strcmp(pcVar2,"BufT");
      if (iVar1 == 0) {
        pName = (char *)Vec_PtrEntry(vGatesNames,3);
      }
      else {
        iVar1 = strcmp(pcVar2,"InvT");
        if (iVar1 == 0) {
          pName = (char *)Vec_PtrEntry(vGatesNames,4);
        }
        else {
          iVar1 = strcmp(pcVar2,"AndT");
          if (iVar1 == 0) {
            pName = (char *)Vec_PtrEntry(vGatesNames,5);
          }
          else {
            iVar1 = strcmp(pcVar2,"NandT");
            if (iVar1 == 0) {
              pName = (char *)Vec_PtrEntry(vGatesNames,6);
            }
            else {
              iVar1 = strcmp(pcVar2,"OrT");
              if (iVar1 == 0) {
                pName = (char *)Vec_PtrEntry(vGatesNames,7);
              }
              else {
                iVar1 = strcmp(pcVar2,"NorT");
                if (iVar1 == 0) {
                  pName = (char *)Vec_PtrEntry(vGatesNames,8);
                }
                else {
                  iVar1 = strcmp(pcVar2,"XorT");
                  if (iVar1 == 0) {
                    pName = (char *)Vec_PtrEntry(vGatesNames,9);
                  }
                  else {
                    iVar1 = strcmp(pcVar2,"XnorT");
                    if (iVar1 != 0) {
                      return;
                    }
                    pName = (char *)Vec_PtrEntry(vGatesNames,10);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (pcVar2 != (char *)0x0) {
    free(pcVar2);
  }
  pcVar2 = Abc_UtilStrsav(pName);
  Vec_PtrWriteEntry(vBox,0,pcVar2);
  pvVar3 = Vec_PtrEntry(vBox,1);
  if (pvVar3 != (void *)0x0) {
    free(pvVar3);
  }
  Vec_PtrWriteEntry(vBox,1,(void *)0x0);
  pGate_00 = Mio_LibraryReadGateByName(pLib_00,pName,(char *)0x0);
  pMStack_28 = Mio_GateReadPins(pGate_00);
  while (pMStack_28 != (Mio_Pin_t *)0x0) {
    pvVar3 = Vec_PtrEntry(vBox,pLib._4_4_ << 1);
    if (pvVar3 != (void *)0x0) {
      free(pvVar3);
    }
    pcVar2 = Mio_PinReadName(pMStack_28);
    pcVar2 = Abc_UtilStrsav(pcVar2);
    Vec_PtrWriteEntry(vBox,pLib._4_4_ << 1,pcVar2);
    pMStack_28 = Mio_PinReadNext(pMStack_28);
    pLib._4_4_ = pLib._4_4_ + 1;
  }
  Vec_PtrEntry(vBox,pLib._4_4_ << 1);
  pcVar2 = Mio_GateReadOutName(pGate_00);
  pcVar2 = Abc_UtilStrsav(pcVar2);
  Vec_PtrWriteEntry(vBox,pLib._4_4_ << 1,pcVar2);
  iVar1 = Vec_PtrSize(vBox);
  if ((pLib._4_4_ + 1) * 2 == iVar1) {
    return;
  }
  __assert_fail("2 * i == Vec_PtrSize(vBox)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacPtr.c"
                ,0x171,"void Bac_PtrUpdateBox(Vec_Ptr_t *, Vec_Ptr_t *)");
}

Assistant:

void Bac_PtrUpdateBox( Vec_Ptr_t * vBox, Vec_Ptr_t * vGatesNames )
{
    Mio_Gate_t * pGate;  Mio_Pin_t * pPin; int i = 1;
    Mio_Library_t * pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
    // update gate name
    char * pNameNew, * pName = (char *)Vec_PtrEntry(vBox, 0);
    if ( !strcmp(pName, "Const0T") )
        pNameNew = (char *)Vec_PtrEntry(vGatesNames, PTR_GATE_C0);
    else if ( !strcmp(pName, "Const1T") )
        pNameNew = (char *)Vec_PtrEntry(vGatesNames, PTR_GATE_C1);
    else if ( !strcmp(pName, "BufT") )
        pNameNew = (char *)Vec_PtrEntry(vGatesNames, PTR_GATE_BUF);
    else if ( !strcmp(pName, "InvT") )
        pNameNew = (char *)Vec_PtrEntry(vGatesNames, PTR_GATE_INV);
    else if ( !strcmp(pName, "AndT") )
        pNameNew = (char *)Vec_PtrEntry(vGatesNames, PTR_GATE_AND);
    else if ( !strcmp(pName, "NandT") )
        pNameNew = (char *)Vec_PtrEntry(vGatesNames, PTR_GATE_NAND);
    else if ( !strcmp(pName, "OrT") )
        pNameNew = (char *)Vec_PtrEntry(vGatesNames, PTR_GATE_OR);
    else if ( !strcmp(pName, "NorT") )
        pNameNew = (char *)Vec_PtrEntry(vGatesNames, PTR_GATE_NOR);
    else if ( !strcmp(pName, "XorT") )
        pNameNew = (char *)Vec_PtrEntry(vGatesNames, PTR_GATE_XOR);
    else if ( !strcmp(pName, "XnorT") )
        pNameNew = (char *)Vec_PtrEntry(vGatesNames, PTR_GATE_XNOR);
    else // user hierarchy
        return;
    ABC_FREE( pName );
    Vec_PtrWriteEntry( vBox, 0, Abc_UtilStrsav(pNameNew) );
    // remove instance name
    pName = (char *)Vec_PtrEntry(vBox, 1);
    ABC_FREE( pName );
    Vec_PtrWriteEntry( vBox, 1, NULL );
    // update formal input names
    pGate = Mio_LibraryReadGateByName( pLib, pNameNew, NULL );
    Mio_GateForEachPin( pGate, pPin )
    {
        pName = (char *)Vec_PtrEntry( vBox, 2 * i );
        ABC_FREE( pName );
        pNameNew = Mio_PinReadName(pPin);
        Vec_PtrWriteEntry( vBox, 2 * i++, Abc_UtilStrsav(pNameNew) );
    }
    // update output name
    pName = (char *)Vec_PtrEntry( vBox, 2 * i );
    pNameNew = Mio_GateReadOutName(pGate);
    Vec_PtrWriteEntry( vBox, 2 * i++, Abc_UtilStrsav(pNameNew) );
    assert( 2 * i == Vec_PtrSize(vBox) );
}